

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exclusion.cpp
# Opt level: O2

string * __thiscall Exclusion::dump_abi_cxx11_(string *__return_storage_ptr__,Exclusion *this)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38," ",&local_39);
  join(__return_storage_ptr__,&local_38,&this->_tokens);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Exclusion::dump () const
{
  return join (" ", _tokens);
}